

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,IfStmt *node)

{
  BuilderContext *pBVar1;
  BBLIter this_00;
  bool bVar2;
  BBLIter iter;
  element_type *peVar3;
  pointer pBVar4;
  LogicalExprInfo *pLVar5;
  element_type *node_00;
  BBLIter *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_180;
  LogicalExprInfo *info;
  BBLIter local_120;
  shared_ptr<mocker::ir::IRInst> local_118;
  BBLIter local_108;
  undefined1 local_100 [8];
  shared_ptr<mocker::ir::Jump> jump;
  undefined1 local_e8 [8];
  shared_ptr<mocker::ir::Label> successorLabel;
  _List_iterator<mocker::ir::BasicBlock> local_d0;
  BBLIter successorBB;
  _List_const_iterator<mocker::ir::BasicBlock> local_b8;
  shared_ptr<mocker::ir::Label> local_b0;
  _List_node_base *local_a0;
  _List_node_base *local_98;
  undefined1 local_90 [8];
  shared_ptr<mocker::ir::Label> elseFirstLabel;
  BBLIter elseLastBB;
  BBLIter elseFirstBB;
  BBLIter thenLastBB;
  _List_const_iterator<mocker::ir::BasicBlock> local_50;
  undefined1 local_48 [8];
  shared_ptr<mocker::ir::Label> thenFirstLabel;
  iterator local_30;
  BBLIter thenFirstBB;
  FunctionModule *func;
  BBLIter originalBB;
  IfStmt *node_local;
  Builder *this_local;
  
  iter = BuilderContext::getCurBasicBlock(this->ctx);
  thenFirstBB._M_node = (_List_node_base *)BuilderContext::getCurFunc(this->ctx);
  thenFirstLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter;
  local_30._M_node =
       (_List_node_base *)FunctionModule::insertBBAfter((FunctionModule *)thenFirstBB._M_node,iter);
  std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator(&local_50,&local_30);
  getBBLabel((Builder *)local_48,(const_iterator)this);
  BuilderContext::setCurBasicBlock(this->ctx,(BBLIter)local_30._M_node);
  peVar3 = std::
           __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&node->then);
  visit<mocker::ast::Statement>(this,peVar3);
  elseFirstBB = BuilderContext::getCurBasicBlock(this->ctx);
  std::_List_iterator<mocker::ir::BasicBlock>::_List_iterator(&elseLastBB);
  std::_List_iterator<mocker::ir::BasicBlock>::_List_iterator
            ((_List_iterator<mocker::ir::BasicBlock> *)
             &elseFirstLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<mocker::ir::Label>::shared_ptr
            ((shared_ptr<mocker::ir::Label> *)local_90,(nullptr_t)0x0);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->else_);
  if (bVar2) {
    local_a0 = elseFirstBB._M_node;
    local_98 = (_List_node_base *)FunctionModule::insertBBAfter(thenFirstBB._M_node,elseFirstBB);
    elseLastBB._M_node = local_98;
    std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator(&local_b8,&elseLastBB);
    getBBLabel((Builder *)&local_b0,(const_iterator)this);
    std::shared_ptr<mocker::ir::Label>::operator=
              ((shared_ptr<mocker::ir::Label> *)local_90,&local_b0);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_b0);
    BuilderContext::setCurBasicBlock(this->ctx,elseLastBB);
    peVar3 = std::
             __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&node->else_);
    visit<mocker::ast::Statement>(this,peVar3);
    successorBB = BuilderContext::getCurBasicBlock(this->ctx);
    elseFirstLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)successorBB;
  }
  this_00._M_node = thenFirstBB._M_node;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->else_);
  if (bVar2) {
    local_180 = &elseFirstLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
  }
  else {
    local_180 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&elseFirstBB;
  }
  successorLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_180->_M_pi;
  local_d0._M_node =
       (_List_node_base *)
       FunctionModule::insertBBAfter
                 (this_00._M_node,
                  (BBLIter)successorLabel.
                           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_d0);
  jump.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BasicBlock::getLabelID(pBVar4);
  std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)local_e8);
  std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
            ((shared_ptr<mocker::ir::Label> *)local_100);
  pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&elseFirstBB);
  bVar2 = BasicBlock::isCompleted(pBVar4);
  if (!bVar2) {
    pBVar1 = this->ctx;
    local_108._M_node = elseFirstBB._M_node;
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
              (&local_118,(shared_ptr<mocker::ir::Jump> *)local_100);
    BuilderContext::appendInst(pBVar1,local_108,&local_118);
    std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_118);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->else_);
  if (bVar2) {
    pBVar4 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       ((_List_iterator<mocker::ir::BasicBlock> *)
                        &elseFirstLabel.
                         super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    bVar2 = BasicBlock::isCompleted(pBVar4);
    if (!bVar2) {
      pBVar1 = this->ctx;
      local_120._M_node =
           (_List_node_base *)
           elseFirstLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                ((shared_ptr<mocker::ir::IRInst> *)&info,(shared_ptr<mocker::ir::Jump> *)local_100);
      BuilderContext::appendInst(pBVar1,local_120,(shared_ptr<mocker::ir::IRInst> *)&info);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)&info);
    }
  }
  pLVar5 = BuilderContext::getLogicalExprInfo(this->ctx);
  pLVar5->inCondition = true;
  (pLVar5->trueNext)._M_node = local_30._M_node;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->else_);
  if (bVar2) {
    local_1d0 = &elseLastBB;
  }
  else {
    local_1d0 = &local_d0;
  }
  (pLVar5->falseNext)._M_node = local_1d0->_M_node;
  pLVar5->empty = false;
  BuilderContext::setCurBasicBlock(this->ctx,iter);
  node_00 = std::
            __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->condition);
  visit<mocker::ast::Expression>(this,node_00);
  pLVar5->empty = true;
  pLVar5->inCondition = false;
  BuilderContext::setCurBasicBlock(this->ctx,(BBLIter)local_d0._M_node);
  std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_100);
  std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_e8);
  std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_90);
  std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_48);
  return;
}

Assistant:

void Builder::operator()(const ast::IfStmt &node) const {
  auto originalBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto thenFirstBB = func.insertBBAfter(originalBB);
  auto thenFirstLabel = getBBLabel(thenFirstBB);
  ctx.setCurBasicBlock(thenFirstBB);
  visit(*node.then);
  auto thenLastBB = ctx.getCurBasicBlock();

  BBLIter elseFirstBB, elseLastBB;
  std::shared_ptr<Label> elseFirstLabel = nullptr;
  if (node.else_) {
    elseFirstBB = func.insertBBAfter(thenLastBB);
    elseFirstLabel = getBBLabel(elseFirstBB);
    ctx.setCurBasicBlock(elseFirstBB);
    visit(*node.else_);
    elseLastBB = ctx.getCurBasicBlock();
  }

  auto successorBB = func.insertBBAfter(node.else_ ? elseLastBB : thenLastBB);
  auto successorLabel = std::make_shared<Label>(successorBB->getLabelID());
  auto jump = std::make_shared<Jump>(successorLabel);
  if (!thenLastBB->isCompleted())
    ctx.appendInst(thenLastBB, jump);
  if (node.else_ && !elseLastBB->isCompleted())
    ctx.appendInst(elseLastBB, jump);

  auto &info = ctx.getLogicalExprInfo();
  info.inCondition = true;
  info.trueNext = thenFirstBB;
  info.falseNext = node.else_ ? elseFirstBB : successorBB;
  info.empty = false;
  ctx.setCurBasicBlock(originalBB);
  visit(*node.condition);
  info.empty = true;
  info.inCondition = false;

  ctx.setCurBasicBlock(successorBB);
}